

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

char * nsvg__parseNumber(char *s,char *it,int size)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  uint local_24;
  int i;
  int last;
  int size_local;
  char *it_local;
  char *s_local;
  
  iVar1 = size + -1;
  local_24 = 0;
  if ((*s == '-') || (it_local = s, *s == '+')) {
    if (0 < iVar1) {
      *it = *s;
    }
    local_24 = (uint)(0 < iVar1);
    it_local = s + 1;
  }
  while( true ) {
    bVar4 = false;
    if (*it_local != '\0') {
      iVar2 = nsvg__isdigit(*it_local);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    if ((int)local_24 < iVar1) {
      it[(int)local_24] = *it_local;
      local_24 = local_24 + 1;
    }
    it_local = it_local + 1;
  }
  if (*it_local == '.') {
    if ((int)local_24 < iVar1) {
      it[(int)local_24] = *it_local;
      local_24 = local_24 + 1;
    }
    while( true ) {
      it_local = it_local + 1;
      bVar4 = false;
      if (*it_local != '\0') {
        iVar2 = nsvg__isdigit(*it_local);
        bVar4 = iVar2 != 0;
      }
      if (!bVar4) break;
      if ((int)local_24 < iVar1) {
        it[(int)local_24] = *it_local;
        local_24 = local_24 + 1;
      }
    }
  }
  if ((*it_local == 'e') || (*it_local == 'E')) {
    if ((int)local_24 < iVar1) {
      it[(int)local_24] = *it_local;
      local_24 = local_24 + 1;
    }
    pcVar3 = it_local + 1;
    if ((*pcVar3 == '-') || (*pcVar3 == '+')) {
      if ((int)local_24 < iVar1) {
        it[(int)local_24] = *pcVar3;
        local_24 = local_24 + 1;
      }
      pcVar3 = it_local + 2;
    }
    while( true ) {
      it_local = pcVar3;
      bVar4 = false;
      if (*it_local != '\0') {
        iVar2 = nsvg__isdigit(*it_local);
        bVar4 = iVar2 != 0;
      }
      if (!bVar4) break;
      if ((int)local_24 < iVar1) {
        it[(int)local_24] = *it_local;
        local_24 = local_24 + 1;
      }
      pcVar3 = it_local + 1;
    }
  }
  it[(int)local_24] = '\0';
  return it_local;
}

Assistant:

static const char* nsvg__parseNumber(const char* s, char* it, const int size)
{
	const int last = size-1;
	int i = 0;

	// sign
	if (*s == '-' || *s == '+') {
		if (i < last) it[i++] = *s;
		s++;
	}
	// integer part
	while (*s && nsvg__isdigit(*s)) {
		if (i < last) it[i++] = *s;
		s++;
	}
	if (*s == '.') {
		// decimal point
		if (i < last) it[i++] = *s;
		s++;
		// fraction part
		while (*s && nsvg__isdigit(*s)) {
			if (i < last) it[i++] = *s;
			s++;
		}
	}
	// exponent
	if (*s == 'e' || *s == 'E') {
		if (i < last) it[i++] = *s;
		s++;
		if (*s == '-' || *s == '+') {
			if (i < last) it[i++] = *s;
			s++;
		}
		while (*s && nsvg__isdigit(*s)) {
			if (i < last) it[i++] = *s;
			s++;
		}
	}
	it[i] = '\0';

	return s;
}